

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

bool ON_GetClosestPointInPointList
               (int point_count,ON_3dPoint *point_list,ON_3dPoint P,int *closest_point_index)

{
  double dVar1;
  int local_50;
  int local_4c;
  int best_i;
  int i;
  double e;
  double x;
  double d2;
  double d;
  bool rc;
  int *closest_point_index_local;
  ON_3dPoint *point_list_local;
  int point_count_local;
  
  d._7_1_ = false;
  if (((0 < point_count) && (point_list != (ON_3dPoint *)0x0)) &&
     (closest_point_index != (int *)0x0)) {
    d2 = 1e+300;
    x = 1e+300;
    local_50 = -1;
    local_4c = point_count;
    closest_point_index_local = (int *)point_list;
    while (local_4c != 0) {
      dVar1 = (*(double *)closest_point_index_local - P.x) *
              (*(double *)closest_point_index_local - P.x);
      if (dVar1 < x) {
        dVar1 = (*(double *)(closest_point_index_local + 2) - P.y) *
                (*(double *)(closest_point_index_local + 2) - P.y) + dVar1;
        if (dVar1 < x) {
          dVar1 = (*(double *)(closest_point_index_local + 4) - P.z) *
                  (*(double *)(closest_point_index_local + 4) - P.z) + dVar1;
          if (dVar1 < x) {
            x = dVar1 * 1.0000000149011612;
            dVar1 = ON_3dPoint::DistanceTo(&P,(ON_3dPoint *)closest_point_index_local);
            if (dVar1 < d2) {
              local_50 = (point_count - (local_4c + -1)) + -1;
              d2 = dVar1;
            }
          }
        }
      }
      closest_point_index_local = closest_point_index_local + 6;
      local_4c = local_4c + -1;
    }
    if (-1 < local_50) {
      if (closest_point_index != (int *)0x0) {
        *closest_point_index = local_50;
      }
      d._7_1_ = true;
    }
  }
  return d._7_1_;
}

Assistant:

bool ON_GetClosestPointInPointList( 
          int point_count,
          const ON_3dPoint* point_list,
          ON_3dPoint P,
          int* closest_point_index
          )
{
  bool rc = false;
  if ( point_count>0 && 0 != point_list && closest_point_index )
  {
    double d = 1.0e300;
    double d2 = 1.0e300;
    double x,e;
    int i;
    int best_i = -1;
    //const double* pl = &point_list[0].x;
    for ( i = point_count; i--; point_list++ )
    {
      e = d2;
      x = point_list->x - P.x;
      e = x*x;
      if ( e >= d2 ) continue;
      x = point_list->y - P.y;
      e += x*x;
      if ( e >= d2 ) continue;
      x = point_list->z - P.z;
      e += x*x;
      if ( e >= d2 ) continue;
      d2 = (1.0+ON_SQRT_EPSILON)*e;
      e = P.DistanceTo(*point_list);
      if ( e < d )
      {
        d = e;
        best_i = point_count-i-1;
      }
    }
    if ( best_i >= 0 )
    {
      if ( closest_point_index )
        *closest_point_index = best_i;
      rc = true;
    }
  }
  return rc;
}